

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGenInitializer.cxx
# Opt level: O1

bool __thiscall cmQtAutoGenInitializer::InitCustomTargets(cmQtAutoGenInitializer *this)

{
  ConfigString *pCVar1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *this_01;
  cmMakefile *pcVar2;
  pointer pcVar3;
  cmGeneratorTarget *pcVar4;
  bool bVar5;
  bool bVar6;
  int iVar7;
  PolicyStatus PVar8;
  uint uVar9;
  string *psVar10;
  cmState *pcVar11;
  cmValue cVar12;
  string *psVar13;
  string *psVar14;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  __first;
  uint uVar15;
  undefined8 uVar16;
  char *extraout_RDX;
  char *extraout_RDX_00;
  char *extraout_RDX_01;
  EmptyElements emptyElements;
  ulong uVar18;
  long lVar19;
  long lVar20;
  cmAlphaNum *pcVar21;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *depName;
  string_view value;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_00;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_01;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_02;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_03;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_04;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_05;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_06;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  init;
  string_view value_00;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_07;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  init_00;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_08;
  string_view value_01;
  string_view prefix;
  string_view value_02;
  string_view value_03;
  string_view prefix_00;
  string_view prefix_01;
  string_view suffix;
  string_view suffix_00;
  string def;
  unsigned_long iVerb;
  string cbd;
  cmList filterList;
  string relativeBuildDir;
  undefined1 local_158 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_138;
  cmAlphaNum *local_130;
  size_type local_128;
  pointer local_120;
  undefined8 local_118;
  size_type local_110;
  char *local_108;
  undefined8 local_100;
  undefined1 *local_f8;
  char *local_f0;
  undefined8 local_e8;
  undefined1 local_e0 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c8 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_98;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_88;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_78;
  string *local_68;
  char *local_60;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_58;
  undefined8 local_40;
  char *pcStack_38;
  char *pcVar17;
  
  iVar7 = (*this->GlobalGen->_vptr_cmGlobalGenerator[0x28])();
  this->MultiConfig = SUB41(iVar7,0);
  cmMakefile::GetDefaultConfiguration_abi_cxx11_((string *)local_158,this->Makefile);
  std::__cxx11::string::operator=((string *)&this->ConfigDefault,(string *)local_158);
  if ((SystemInformationImplementation *)local_158._0_8_ !=
      (SystemInformationImplementation *)(local_158 + 0x10)) {
    operator_delete((void *)local_158._0_8_,local_158._16_8_ + 1);
  }
  cmMakefile::GetGeneratorConfigs_abi_cxx11_
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_e0,this->Makefile,IncludeEmptyConfig);
  local_158._0_8_ =
       (this->ConfigsList).
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_158._8_8_ =
       (this->ConfigsList).
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_158._16_8_ =
       (this->ConfigsList).
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (this->ConfigsList).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)local_e0._0_8_;
  (this->ConfigsList).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_e0._8_8_;
  (this->ConfigsList).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_e0._16_8_;
  local_e0._0_8_ = (pointer)0x0;
  local_e0._8_8_ = (cmAlphaNum *)0x0;
  local_e0._16_8_ =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        *)0x0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_158);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_e0);
  pcVar2 = this->Makefile;
  pcVar21 = (cmAlphaNum *)(local_e0 + 0x10);
  local_e0._0_8_ = pcVar21;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_e0,"CMAKE_AUTOGEN_VERBOSE","");
  psVar10 = cmMakefile::GetSafeDefinition(pcVar2,(string *)local_e0);
  local_158._0_8_ = local_158 + 0x10;
  pcVar3 = (psVar10->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_158,pcVar3,pcVar3 + psVar10->_M_string_length);
  if ((cmAlphaNum *)local_e0._0_8_ != pcVar21) {
    operator_delete((void *)local_e0._0_8_,(ulong)(local_e0._16_8_ + 1));
  }
  if ((pointer)local_158._8_8_ != (pointer)0x0) {
    local_e0._0_8_ = (cmAlphaNum *)0x0;
    bVar5 = cmStrToULong((string *)local_158,(unsigned_long *)local_e0);
    if (bVar5) {
      uVar15 = local_e0._0_4_;
    }
    else {
      value._M_str = extraout_RDX;
      value._M_len = local_158._0_8_;
      bVar5 = cmValue::IsOn((cmValue *)local_158._8_8_,value);
      uVar15 = 1;
      if (!bVar5) goto LAB_0039e07c;
    }
    this->Verbosity = uVar15;
  }
LAB_0039e07c:
  if ((SystemInformationImplementation *)local_158._0_8_ !=
      (SystemInformationImplementation *)(local_158 + 0x10)) {
    operator_delete((void *)local_158._0_8_,(ulong)(local_158._16_8_ + 1));
  }
  pcVar11 = cmMakefile::GetState(this->Makefile);
  local_158._0_8_ = local_158 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_158,"AUTOMOC_TARGETS_FOLDER","");
  cVar12 = cmState::GetGlobalProperty(pcVar11,(string *)local_158);
  if ((SystemInformationImplementation *)local_158._0_8_ !=
      (SystemInformationImplementation *)(local_158 + 0x10)) {
    operator_delete((void *)local_158._0_8_,(ulong)(local_158._16_8_ + 1));
  }
  if (cVar12.Value == (string *)0x0) {
    pcVar11 = cmMakefile::GetState(this->Makefile);
    local_158._0_8_ = local_158 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_158,"AUTOGEN_TARGETS_FOLDER","")
    ;
    cVar12 = cmState::GetGlobalProperty(pcVar11,(string *)local_158);
    if ((SystemInformationImplementation *)local_158._0_8_ !=
        (SystemInformationImplementation *)(local_158 + 0x10)) {
      operator_delete((void *)local_158._0_8_,(ulong)(local_158._16_8_ + 1));
    }
  }
  if (cVar12.Value == (string *)0x0) {
    pcVar4 = this->GenTarget;
    local_158._0_8_ = local_158 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_158,"FOLDER","");
    cVar12 = cmGeneratorTarget::GetProperty(pcVar4,(string *)local_158);
    if ((SystemInformationImplementation *)local_158._0_8_ !=
        (SystemInformationImplementation *)(local_158 + 0x10)) {
      operator_delete((void *)local_158._0_8_,(ulong)(local_158._16_8_ + 1));
    }
  }
  if (cVar12.Value != (string *)0x0) {
    std::__cxx11::string::_M_assign((string *)&this->TargetsFolder);
  }
  PVar8 = cmMakefile::GetPolicyStatus(this->Makefile,CMP0071,false);
  if (PVar8 - NEW < 3) {
    this->CMP0071Accept = true;
  }
  else if (PVar8 == WARN) {
    this->CMP0071Warn = true;
  }
  PVar8 = cmMakefile::GetPolicyStatus(this->Makefile,CMP0100,false);
  if (PVar8 - NEW < 3) {
    this->CMP0100Accept = true;
  }
  else if (PVar8 == WARN) {
    this->CMP0100Warn = true;
  }
  local_60 = local_58._M_local_buf + 8;
  local_58._M_allocated_capacity = 0;
  local_58._M_local_buf[8] = '\0';
  local_158._0_8_ = local_158 + 0x10;
  local_158._8_8_ = (pointer)0x0;
  local_158._16_8_ = local_158._16_8_ & 0xffffffffffffff00;
  psVar10 = cmMakefile::GetCurrentBinaryDirectory_abi_cxx11_(this->Makefile);
  cmsys::SystemTools::CollapseFullPath((string *)&local_a8,(string *)local_158,psVar10);
  if ((SystemInformationImplementation *)local_158._0_8_ !=
      (SystemInformationImplementation *)(local_158 + 0x10)) {
    operator_delete((void *)local_158._0_8_,local_158._16_8_ + 1);
  }
  psVar10 = cmGeneratorTarget::GetName_abi_cxx11_(this->GenTarget);
  local_158._0_8_ = local_a8._8_8_;
  local_158._8_8_ = local_a8._M_allocated_capacity;
  local_158._16_8_ = 0;
  local_158._24_8_ = 0xc;
  local_138 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0x973dc9;
  local_130 = (cmAlphaNum *)0x0;
  local_120 = (psVar10->_M_dataplus)._M_p;
  local_128 = psVar10->_M_string_length;
  local_118 = 0;
  local_110 = 0xc;
  local_108 = "_autogen.dir";
  local_100 = 0;
  views._M_len = 4;
  views._M_array = (iterator)local_158;
  cmCatViews((string *)local_e0,views);
  std::__cxx11::string::operator=((string *)&this->Dir,(string *)local_e0);
  if ((cmAlphaNum *)local_e0._0_8_ != pcVar21) {
    operator_delete((void *)local_e0._0_8_,(ulong)(local_e0._16_8_ + 1));
  }
  cmsys::SystemTools::ConvertToUnixSlashes(&(this->Dir).Info);
  pcVar4 = this->GenTarget;
  local_158._0_8_ = local_158 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_158,"AUTOGEN_BUILD_DIR","");
  cmGeneratorTarget::GetSafeProperty(pcVar4,(string *)local_158);
  psVar10 = &(this->Dir).Build;
  std::__cxx11::string::_M_assign((string *)psVar10);
  if ((SystemInformationImplementation *)local_158._0_8_ !=
      (SystemInformationImplementation *)(local_158 + 0x10)) {
    operator_delete((void *)local_158._0_8_,local_158._16_8_ + 1);
  }
  if ((this->Dir).Build._M_string_length == 0) {
    psVar13 = cmGeneratorTarget::GetName_abi_cxx11_(this->GenTarget);
    local_158._0_8_ = local_a8._8_8_;
    local_158._8_8_ = local_a8._M_allocated_capacity;
    local_158._16_8_ = 0;
    local_138 = local_c8;
    local_e0._0_8_ = (cmAlphaNum *)0x0;
    local_e0._8_8_ = &DAT_00000001;
    local_c8[0]._M_local_buf[0] = '/';
    local_158._24_8_ = 1;
    local_130 = (cmAlphaNum *)0x0;
    local_120 = (psVar13->_M_dataplus)._M_p;
    local_128 = psVar13->_M_string_length;
    local_118 = 0;
    local_110 = 8;
    local_108 = "_autogen";
    local_100 = 0;
    views_00._M_len = 4;
    views_00._M_array = (iterator)local_158;
    local_e0._16_8_ = local_138;
    cmCatViews((string *)&local_88,views_00);
    std::__cxx11::string::operator=((string *)psVar10,(string *)local_88._M_local_buf);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_allocated_capacity != &local_78) {
      operator_delete((void *)local_88._M_allocated_capacity,local_78._M_allocated_capacity + 1);
    }
  }
  cmsys::SystemTools::ConvertToUnixSlashes(psVar10);
  cmSystemTools::RelativePath((string *)local_158,(string *)&local_a8,psVar10);
  std::__cxx11::string::operator=((string *)&(this->Dir).RelativeBuild,(string *)local_158);
  if ((SystemInformationImplementation *)local_158._0_8_ !=
      (SystemInformationImplementation *)(local_158 + 0x10)) {
    operator_delete((void *)local_158._0_8_,local_158._16_8_ + 1);
  }
  AddCleanFile(this,psVar10);
  psVar10 = &(this->Dir).Work;
  std::__cxx11::string::_M_assign((string *)psVar10);
  cmsys::SystemTools::ConvertToUnixSlashes(psVar10);
  local_158._8_8_ = (this->Dir).Build._M_dataplus._M_p;
  local_158._0_8_ = (this->Dir).Build._M_string_length;
  local_158._16_8_ = 0;
  local_158._24_8_ = 8;
  local_138 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0x9375a0;
  local_130 = (cmAlphaNum *)0x0;
  views_01._M_len = 2;
  views_01._M_array = (iterator)local_158;
  cmCatViews((string *)local_e0,views_01);
  psVar10 = &(this->Dir).IncludeGenExp;
  local_40 = 0;
  pcStack_38 = "";
  prefix._M_str = (char *)local_e0._0_8_;
  prefix._M_len = local_e0._8_8_;
  ConfigFileNamesAndGenex
            (this,&(this->Dir).Include,psVar10,prefix,(string_view)(ZEXT816(0x9ac4f5) << 0x40));
  if ((cmAlphaNum *)local_e0._0_8_ != pcVar21) {
    operator_delete((void *)local_e0._0_8_,(ulong)(local_e0._16_8_ + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_allocated_capacity != &local_98) {
    operator_delete((void *)local_a8._M_allocated_capacity,local_98._M_allocated_capacity + 1);
  }
  bVar5 = (this->Moc).super_GenVarsT.Enabled;
  if ((bVar5 == false) && (((this->Uic).super_GenVarsT.Enabled & 1U) == 0)) {
LAB_0039f005:
    if (((this->Rcc).super_GenVarsT.Enabled != true) || (bVar5 = InitRcc(this), bVar5)) {
      if ((((this->Moc).super_GenVarsT.Enabled != false) ||
          (((this->Uic).super_GenVarsT.Enabled & 1U) != 0)) ||
         (((this->Rcc).super_GenVarsT.Enabled == true && (this->MultiConfig == true)))) {
        pcVar4 = this->GenTarget;
        local_158._0_8_ = local_158 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_158,"AUTOGEN_USE_SYSTEM_INCLUDE","");
        local_e0._0_8_ = cmGeneratorTarget::GetProperty(pcVar4,(string *)local_158);
        if ((SystemInformationImplementation *)local_158._0_8_ !=
            (SystemInformationImplementation *)(local_158 + 0x10)) {
          operator_delete((void *)local_158._0_8_,local_158._16_8_ + 1);
        }
        bVar5 = cmValue::IsSet((cmValue *)local_e0);
        if (bVar5) {
          bVar5 = true;
          if (((cmAlphaNum *)local_e0._0_8_ != (cmAlphaNum *)0x0) &&
             (value_01._M_str = extraout_RDX_01,
             value_01._M_len = (size_t)((_Alloc_hider *)local_e0._0_8_)->_M_p,
             bVar6 = cmValue::IsOn((cmValue *)((string_view *)(local_e0._0_8_ + 8))->_M_len,value_01
                                  ), bVar6)) {
            pcVar4 = this->GenTarget;
            local_158._0_8_ = local_158 + 0x10;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_158,"CXX","");
            cmGeneratorTarget::AddSystemIncludeDirectory(pcVar4,psVar10,(string *)local_158);
LAB_0039f15a:
            if ((SystemInformationImplementation *)local_158._0_8_ !=
                (SystemInformationImplementation *)(local_158 + 0x10)) {
              operator_delete((void *)local_158._0_8_,local_158._16_8_ + 1);
            }
            goto LAB_0039f182;
          }
        }
        else {
          PVar8 = cmMakefile::GetPolicyStatus(this->Makefile,CMP0151,false);
          if (PVar8 - NEW < 3) {
            pcVar4 = this->GenTarget;
            local_158._0_8_ = local_158 + 0x10;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_158,"CXX","");
            cmGeneratorTarget::AddSystemIncludeDirectory(pcVar4,psVar10,(string *)local_158);
            goto LAB_0039f15a;
          }
          if (PVar8 < NEW) {
            bVar5 = true;
            goto LAB_0039f184;
          }
LAB_0039f182:
          bVar5 = false;
        }
LAB_0039f184:
        cmGeneratorTarget::AddIncludeDirectory(this->GenTarget,psVar10,bVar5);
      }
      bVar5 = InitScanFiles(this);
      if (bVar5) {
        if (((this->Moc).super_GenVarsT.Enabled != false) ||
           (((this->Uic).super_GenVarsT.Enabled & 1U) != 0)) {
          InitAutogenTarget(this);
        }
        bVar5 = true;
        if ((this->Rcc).super_GenVarsT.Enabled == true) {
          InitRccTargets(this);
        }
        goto LAB_0039f1d2;
      }
    }
  }
  else if (((bVar5 == false) || (bVar5 = InitMoc(this), bVar5)) &&
          (((this->Uic).super_GenVarsT.Enabled != true || (bVar5 = InitUic(this), bVar5)))) {
    psVar13 = cmGeneratorTarget::GetName_abi_cxx11_(this->GenTarget);
    local_158._8_8_ = (psVar13->_M_dataplus)._M_p;
    local_158._0_8_ = psVar13->_M_string_length;
    local_158._16_8_ = 0;
    local_158._24_8_ = 8;
    local_138 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)0x93fff9;
    local_130 = (cmAlphaNum *)0x0;
    views_02._M_len = 2;
    views_02._M_array = (iterator)local_158;
    cmCatViews((string *)local_e0,views_02);
    std::__cxx11::string::operator=((string *)&this->AutogenTarget,(string *)local_e0);
    if ((cmAlphaNum *)local_e0._0_8_ != pcVar21) {
      operator_delete((void *)local_e0._0_8_,(ulong)(local_e0._16_8_ + 1));
    }
    local_a8._M_allocated_capacity = 0;
    pcVar4 = this->GenTarget;
    local_158._0_8_ = local_158 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_158,"AUTOGEN_PARALLEL","");
    psVar13 = cmGeneratorTarget::GetSafeProperty(pcVar4,(string *)local_158);
    if ((SystemInformationImplementation *)local_158._0_8_ !=
        (SystemInformationImplementation *)(local_158 + 0x10)) {
      operator_delete((void *)local_158._0_8_,local_158._16_8_ + 1);
    }
    if ((psVar13->_M_string_length == 0) ||
       (iVar7 = std::__cxx11::string::compare((char *)psVar13), iVar7 == 0)) {
      if ((anonymous_namespace)::GetParallelCPUCount()::count == 0) {
        cmsys::SystemInformation::SystemInformation((SystemInformation *)local_158);
        cmsys::SystemInformation::RunCPUCheck((SystemInformation *)local_158);
        uVar9 = cmsys::SystemInformation::GetNumberOfPhysicalCPU((SystemInformation *)local_158);
        uVar15 = 0x40;
        if (uVar9 < 0x41) {
          uVar15 = uVar9;
        }
        (anonymous_namespace)::GetParallelCPUCount()::count = 1;
        if (uVar9 != 0) {
          (anonymous_namespace)::GetParallelCPUCount()::count = uVar15;
        }
        cmsys::SystemInformation::~SystemInformation((SystemInformation *)local_158);
      }
      uVar16 = ZEXT48((anonymous_namespace)::GetParallelCPUCount()::count);
    }
    else {
      bVar5 = cmStrToULong(psVar13,&local_a8._M_allocated_capacity);
      uVar16 = local_a8._M_allocated_capacity;
      if (!bVar5 || (undefined1 *)0xfffffffe < (undefined1 *)(local_a8._M_allocated_capacity - 1)) {
        pcVar2 = this->Makefile;
        psVar14 = cmGeneratorTarget::GetName_abi_cxx11_(this->GenTarget);
        local_158._0_8_ = (SystemInformationImplementation *)0x12;
        local_158._8_8_ = "AUTOGEN_PARALLEL=\"";
        local_158._16_8_ = 0;
        local_138 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(psVar13->_M_dataplus)._M_p;
        local_158._24_8_ = psVar13->_M_string_length;
        local_130 = (cmAlphaNum *)0x0;
        local_128 = 0xe;
        local_120 = "\" for target \"";
        local_118 = 0;
        local_108 = (psVar14->_M_dataplus)._M_p;
        local_110 = psVar14->_M_string_length;
        local_100 = 0;
        local_f8 = &DAT_00000028;
        local_f0 = "\" is not valid. Using AUTOGEN_PARALLEL=1";
        local_e8 = 0;
        views_03._M_len = 5;
        views_03._M_array = (iterator)local_158;
        cmCatViews((string *)local_e0,views_03);
        cmMakefile::IssueMessage(pcVar2,AUTHOR_WARNING,(string *)local_e0);
        if ((cmAlphaNum *)local_e0._0_8_ != pcVar21) {
          operator_delete((void *)local_e0._0_8_,(ulong)(local_e0._16_8_ + 1));
        }
        uVar16 = &DAT_00000001;
      }
    }
    (this->AutogenTarget).Parallel = (uint)uVar16;
    local_158._8_8_ = (this->Dir).Info._M_dataplus._M_p;
    local_158._0_8_ = (this->Dir).Info._M_string_length;
    local_158._16_8_ = 0;
    local_158._24_8_ = 0x11;
    local_138 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)0x93faca;
    local_130 = (cmAlphaNum *)0x0;
    views_04._M_len = 2;
    views_04._M_array = (iterator)local_158;
    cmCatViews((string *)local_e0,views_04);
    std::__cxx11::string::operator=((string *)&(this->AutogenTarget).InfoFile,(string *)local_e0);
    if ((cmAlphaNum *)local_e0._0_8_ != pcVar21) {
      operator_delete((void *)local_e0._0_8_,(ulong)(local_e0._16_8_ + 1));
    }
    local_158._8_8_ = (this->Dir).Info._M_dataplus._M_p;
    local_158._0_8_ = (this->Dir).Info._M_string_length;
    local_158._16_8_ = 0;
    local_158._24_8_ = 0xc;
    local_138 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)0x93fadc;
    local_130 = (cmAlphaNum *)0x0;
    views_05._M_len = 2;
    views_05._M_array = (iterator)local_158;
    cmCatViews((string *)local_e0,views_05);
    pCVar1 = &(this->AutogenTarget).SettingsFile;
    prefix_00._M_str = (char *)local_e0._0_8_;
    prefix_00._M_len = local_e0._8_8_;
    suffix._M_str = ".txt";
    suffix._M_len = 4;
    ConfigFileNames(this,pCVar1,prefix_00,suffix);
    if ((cmAlphaNum *)local_e0._0_8_ != pcVar21) {
      operator_delete((void *)local_e0._0_8_,(ulong)(local_e0._16_8_ + 1));
    }
    ConfigFileClean(this,pCVar1);
    local_158._8_8_ = (this->Dir).Info._M_dataplus._M_p;
    local_158._0_8_ = (this->Dir).Info._M_string_length;
    local_158._16_8_ = 0;
    local_158._24_8_ = 0xb;
    local_138 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)0x93fae9;
    local_130 = (cmAlphaNum *)0x0;
    views_06._M_len = 2;
    views_06._M_array = (iterator)local_158;
    cmCatViews((string *)local_e0,views_06);
    pCVar1 = &(this->AutogenTarget).ParseCacheFile;
    prefix_01._M_str = (char *)local_e0._0_8_;
    prefix_01._M_len = local_e0._8_8_;
    suffix_00._M_str = ".txt";
    suffix_00._M_len = 4;
    pcVar17 = ".txt";
    ConfigFileNames(this,pCVar1,prefix_01,suffix_00);
    if ((cmAlphaNum *)local_e0._0_8_ != pcVar21) {
      operator_delete((void *)local_e0._0_8_,(ulong)(local_e0._16_8_ + 1));
    }
    ConfigFileClean(this,pCVar1);
    pcVar4 = this->GenTarget;
    local_158._0_8_ = local_158 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_158,"AUTOGEN_ORIGIN_DEPENDS","")
    ;
    bVar5 = cmGeneratorTarget::GetPropertyAsBool(pcVar4,(string *)local_158);
    (this->AutogenTarget).DependOrigin = bVar5;
    if ((SystemInformationImplementation *)local_158._0_8_ !=
        (SystemInformationImplementation *)(local_158 + 0x10)) {
      operator_delete((void *)local_158._0_8_,local_158._16_8_ + 1);
    }
    pcVar4 = this->GenTarget;
    local_158._0_8_ = local_158 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_158,"AUTOGEN_TARGET_DEPENDS","")
    ;
    psVar13 = cmGeneratorTarget::GetSafeProperty(pcVar4,(string *)local_158);
    if ((SystemInformationImplementation *)local_158._0_8_ !=
        (SystemInformationImplementation *)(local_158 + 0x10)) {
      operator_delete((void *)local_158._0_8_,local_158._16_8_ + 1);
    }
    emptyElements = (EmptyElements)pcVar17;
    local_68 = psVar10;
    if (psVar13->_M_string_length != 0) {
      local_158._0_8_ = local_158 + 0x10;
      pcVar3 = (psVar13->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_158,pcVar3,pcVar3 + psVar13->_M_string_length);
      init._M_len = 1;
      init._M_array = (iterator)local_158;
      cmList::cmList((cmList *)local_e0,init);
      if ((SystemInformationImplementation *)local_158._0_8_ !=
          (SystemInformationImplementation *)(local_158 + 0x10)) {
        operator_delete((void *)local_158._0_8_,local_158._16_8_ + 1);
      }
      uVar16 = local_e0._8_8_;
      emptyElements = (EmptyElements)pcVar17;
      if (local_e0._0_8_ != local_e0._8_8_) {
        pcVar21 = (cmAlphaNum *)local_e0._0_8_;
        do {
          local_158._0_8_ = cmMakefile::FindTargetToUse(this->Makefile,(string *)pcVar21,false);
          if ((SystemInformationImplementation *)local_158._0_8_ ==
              (SystemInformationImplementation *)0x0) {
            std::
            _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
            ::_M_insert_unique<std::__cxx11::string_const&>
                      ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                        *)&(this->AutogenTarget).DependFiles,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pcVar21)
            ;
          }
          else {
            std::
            _Rb_tree<cmTarget*,cmTarget*,std::_Identity<cmTarget*>,std::less<cmTarget*>,std::allocator<cmTarget*>>
            ::_M_insert_unique<cmTarget*const&>
                      ((_Rb_tree<cmTarget*,cmTarget*,std::_Identity<cmTarget*>,std::less<cmTarget*>,std::allocator<cmTarget*>>
                        *)&(this->AutogenTarget).DependTargets,(cmTarget **)local_158);
          }
          emptyElements = (EmptyElements)pcVar17;
          pcVar21 = (cmAlphaNum *)(pcVar21->Digits_ + 8);
        } while (pcVar21 != (cmAlphaNum *)uVar16);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_e0);
    }
    psVar10 = local_68;
    if ((this->Moc).super_GenVarsT.Enabled == true) {
      pcVar4 = this->GenTarget;
      local_158._0_8_ = local_158 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_158,"AUTOMOC_PATH_PREFIX","");
      cVar12 = cmGeneratorTarget::GetProperty(pcVar4,(string *)local_158);
      if (cVar12.Value == (string *)0x0) {
        bVar5 = false;
      }
      else {
        value_00._M_str = extraout_RDX_00;
        value_00._M_len = (size_t)((cVar12.Value)->_M_dataplus)._M_p;
        bVar5 = cmValue::IsOn((cmValue *)(cVar12.Value)->_M_string_length,value_00);
      }
      if ((SystemInformationImplementation *)local_158._0_8_ !=
          (SystemInformationImplementation *)(local_158 + 0x10)) {
        operator_delete((void *)local_158._0_8_,local_158._16_8_ + 1);
      }
      if (bVar5 != false) {
        (this->Moc).PathPrefix = true;
      }
      pcVar2 = this->Makefile;
      local_158._0_8_ = local_158 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_158,"CMAKE_AUTOMOC_RELAXED_MODE","");
      bVar5 = cmMakefile::IsOn(pcVar2,(string *)local_158);
      if ((SystemInformationImplementation *)local_158._0_8_ !=
          (SystemInformationImplementation *)(local_158 + 0x10)) {
        operator_delete((void *)local_158._0_8_,local_158._16_8_ + 1);
      }
      pcVar21 = (cmAlphaNum *)(local_e0 + 0x10);
      if (bVar5) {
        (this->Moc).RelaxedMode = true;
        pcVar2 = this->Makefile;
        psVar10 = cmGeneratorTarget::GetName_abi_cxx11_(this->GenTarget);
        local_158._0_8_ = (SystemInformationImplementation *)0x85;
        local_158._8_8_ =
             "AUTOMOC: CMAKE_AUTOMOC_RELAXED_MODE is deprecated an will be removed in the future.  Consider disabling it and converting the target "
        ;
        local_158._16_8_ = 0;
        local_138 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(psVar10->_M_dataplus)._M_p;
        local_158._24_8_ = psVar10->_M_string_length;
        local_130 = (cmAlphaNum *)0x0;
        local_128 = 0x11;
        local_120 = " to regular mode.";
        local_118 = 0;
        views_07._M_len = 3;
        views_07._M_array = (iterator)local_158;
        cmCatViews((string *)local_e0,views_07);
        cmMakefile::IssueMessage(pcVar2,AUTHOR_WARNING,(string *)local_e0);
        if ((cmAlphaNum *)local_e0._0_8_ != pcVar21) {
          operator_delete((void *)local_e0._0_8_,(ulong)(local_e0._16_8_ + 1));
        }
      }
      pcVar4 = this->GenTarget;
      local_158._0_8_ = local_158 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_158,"AUTOMOC_MOC_OPTIONS","");
      psVar10 = cmGeneratorTarget::GetSafeProperty(pcVar4,(string *)local_158);
      value_02._M_str = (char *)0x0;
      value_02._M_len = (size_t)(psVar10->_M_dataplus)._M_p;
      cmList::insert((cmList *)&(this->Moc).Options,
                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)(this->Moc).Options.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     psVar10->_M_string_length,value_02,emptyElements);
      if ((SystemInformationImplementation *)local_158._0_8_ !=
          (SystemInformationImplementation *)(local_158 + 0x10)) {
        operator_delete((void *)local_158._0_8_,local_158._16_8_ + 1);
      }
      pcVar4 = this->GenTarget;
      local_158._0_8_ = local_158 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_158,"AUTOMOC_MACRO_NAMES","");
      psVar10 = cmGeneratorTarget::GetSafeProperty(pcVar4,(string *)local_158);
      this_00 = &(this->Moc).MacroNames;
      value_03._M_str = (char *)0x0;
      value_03._M_len = (size_t)(psVar10->_M_dataplus)._M_p;
      cmList::insert((cmList *)this_00,
                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)(this->Moc).MacroNames.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     psVar10->_M_string_length,value_03,emptyElements);
      if ((SystemInformationImplementation *)local_158._0_8_ !=
          (SystemInformationImplementation *)(local_158 + 0x10)) {
        operator_delete((void *)local_158._0_8_,local_158._16_8_ + 1);
      }
      __first = cmRemoveDuplicates<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                          ((this->Moc).MacroNames.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start,
                           (this->Moc).MacroNames.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::_M_erase(this_00,(iterator)__first._M_current,
                 (this->Moc).MacroNames.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish);
      pcVar4 = this->GenTarget;
      local_e0._0_8_ = pcVar21;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_e0,"AUTOMOC_DEPEND_FILTERS","");
      psVar10 = cmGeneratorTarget::GetSafeProperty(pcVar4,(string *)local_e0);
      local_158._0_8_ = local_158 + 0x10;
      pcVar3 = (psVar10->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_158,pcVar3,pcVar3 + psVar10->_M_string_length);
      init_00._M_len = 1;
      init_00._M_array = (iterator)local_158;
      cmList::cmList((cmList *)&local_88,init_00);
      if ((SystemInformationImplementation *)local_158._0_8_ !=
          (SystemInformationImplementation *)(local_158 + 0x10)) {
        operator_delete((void *)local_158._0_8_,local_158._16_8_ + 1);
      }
      if ((cmAlphaNum *)local_e0._0_8_ != pcVar21) {
        operator_delete((void *)local_e0._0_8_,(ulong)(local_e0._16_8_ + 1));
      }
      uVar18 = local_88._8_8_ - local_88._0_8_;
      if ((uVar18 & 0x20) == 0) {
        this_01 = &(this->Moc).DependFilters;
        std::
        vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::reserve(this_01,((ulong)((long)uVar18 >> 5) >> 1) + 1);
        std::
        vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
        ::emplace_back<char_const(&)[18],char_const(&)[57]>
                  ((vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
                    *)this_01,(char (*) [18])"Q_PLUGIN_METADATA",
                   (char (*) [57])
                   "[\n][ \t]*Q_PLUGIN_METADATA[ \t]*\\([^\\)]*FILE[ \t]*\"([^\"]+)\"");
        if (local_88._8_8_ != local_88._M_allocated_capacity) {
          lVar20 = 0x20;
          lVar19 = 0;
          do {
            std::
            vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
            ::emplace_back<std::__cxx11::string_const&,std::__cxx11::string_const&>
                      ((vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
                        *)this_01,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((char *)(local_88._M_allocated_capacity + lVar20) + -0x20),
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (local_88._M_allocated_capacity + lVar20));
            lVar19 = lVar19 + 2;
            lVar20 = lVar20 + 0x40;
          } while (lVar19 != (long)(local_88._8_8_ - local_88._0_8_) >> 5);
        }
      }
      else {
        local_158._0_8_ = (SystemInformationImplementation *)0x2d;
        local_158._8_8_ = "AutoMoc: AUTOMOC_DEPEND_FILTERS predefs size ";
        local_158._16_8_ = 0;
        cmAlphaNum::cmAlphaNum((cmAlphaNum *)local_e0,(long)uVar18 >> 5);
        if ((cmAlphaNum *)local_e0._0_8_ != (cmAlphaNum *)0x0) {
          pcVar21 = (cmAlphaNum *)local_e0._0_8_;
        }
        local_138 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)pcVar21->RValueString_;
        pcVar21 = (cmAlphaNum *)local_e0;
        if ((cmAlphaNum *)local_e0._0_8_ != (cmAlphaNum *)0x0) {
          pcVar21 = (cmAlphaNum *)local_e0._0_8_;
        }
        local_158._24_8_ = (pcVar21->View_)._M_len;
        local_130 = (cmAlphaNum *)local_e0._0_8_;
        local_128 = 0x18;
        local_120 = " is not a multiple of 2.";
        local_118 = 0;
        views_08._M_len = 3;
        views_08._M_array = (iterator)local_158;
        cmCatViews((string *)&local_a8,views_08);
        cmSystemTools::Error((string *)&local_a8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a8._M_allocated_capacity != &local_98) {
          operator_delete((void *)local_a8._M_allocated_capacity,local_98._M_allocated_capacity + 1)
          ;
        }
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_88);
      psVar10 = local_68;
      if ((uVar18 & 0x20) != 0) goto LAB_0039f1d0;
    }
    goto LAB_0039f005;
  }
LAB_0039f1d0:
  bVar5 = false;
LAB_0039f1d2:
  if (local_60 != local_58._M_local_buf + 8) {
    operator_delete(local_60,CONCAT71(local_58._9_7_,local_58._M_local_buf[8]) + 1);
  }
  return bVar5;
}

Assistant:

bool cmQtAutoGenInitializer::InitCustomTargets()
{
  // Configurations
  this->MultiConfig = this->GlobalGen->IsMultiConfig();
  this->ConfigDefault = this->Makefile->GetDefaultConfiguration();
  this->ConfigsList =
    this->Makefile->GetGeneratorConfigs(cmMakefile::IncludeEmptyConfig);

  // Verbosity
  {
    std::string const def =
      this->Makefile->GetSafeDefinition("CMAKE_AUTOGEN_VERBOSE");
    if (!def.empty()) {
      unsigned long iVerb = 0;
      if (cmStrToULong(def, &iVerb)) {
        // Numeric verbosity
        this->Verbosity = static_cast<unsigned int>(iVerb);
      } else {
        // Non numeric verbosity
        if (cmIsOn(def)) {
          this->Verbosity = 1;
        }
      }
    }
  }

  // Targets FOLDER
  {
    cmValue folder =
      this->Makefile->GetState()->GetGlobalProperty("AUTOMOC_TARGETS_FOLDER");
    if (!folder) {
      folder = this->Makefile->GetState()->GetGlobalProperty(
        "AUTOGEN_TARGETS_FOLDER");
    }
    // Inherit FOLDER property from target (#13688)
    if (!folder) {
      folder = this->GenTarget->GetProperty("FOLDER");
    }
    if (folder) {
      this->TargetsFolder = *folder;
    }
  }

  // Check status of policy CMP0071 regarding handling of GENERATED files
  switch (this->Makefile->GetPolicyStatus(cmPolicies::CMP0071)) {
    case cmPolicies::WARN:
      // Ignore GENERATED files but warn
      this->CMP0071Warn = true;
      CM_FALLTHROUGH;
    case cmPolicies::OLD:
      // Ignore GENERATED files
      break;
    case cmPolicies::REQUIRED_IF_USED:
    case cmPolicies::REQUIRED_ALWAYS:
    case cmPolicies::NEW:
      // Process GENERATED files
      this->CMP0071Accept = true;
      break;
  }

  // Check status of policy CMP0100 regarding handling of .hh headers
  switch (this->Makefile->GetPolicyStatus(cmPolicies::CMP0100)) {
    case cmPolicies::WARN:
      // Ignore but .hh files but warn
      this->CMP0100Warn = true;
      CM_FALLTHROUGH;
    case cmPolicies::OLD:
      // Ignore .hh files
      break;
    case cmPolicies::REQUIRED_IF_USED:
    case cmPolicies::REQUIRED_ALWAYS:
    case cmPolicies::NEW:
      // Process .hh file
      this->CMP0100Accept = true;
      break;
  }

  // Common directories
  std::string relativeBuildDir;
  {
    // Collapsed current binary directory
    std::string const cbd = cmSystemTools::CollapseFullPath(
      std::string(), this->Makefile->GetCurrentBinaryDirectory());

    // Info directory
    this->Dir.Info = cmStrCat(cbd, "/CMakeFiles/", this->GenTarget->GetName(),
                              "_autogen.dir");
    cmSystemTools::ConvertToUnixSlashes(this->Dir.Info);

    // Build directory
    this->Dir.Build = this->GenTarget->GetSafeProperty("AUTOGEN_BUILD_DIR");
    if (this->Dir.Build.empty()) {
      this->Dir.Build =
        cmStrCat(cbd, '/', this->GenTarget->GetName(), "_autogen");
    }
    cmSystemTools::ConvertToUnixSlashes(this->Dir.Build);
    this->Dir.RelativeBuild =
      cmSystemTools::RelativePath(cbd, this->Dir.Build);
    // Cleanup build directory
    this->AddCleanFile(this->Dir.Build);

    // Working directory
    this->Dir.Work = cbd;
    cmSystemTools::ConvertToUnixSlashes(this->Dir.Work);

    // Include directory
    this->ConfigFileNamesAndGenex(this->Dir.Include, this->Dir.IncludeGenExp,
                                  cmStrCat(this->Dir.Build, "/include"), "");
  }

  // Moc, Uic and _autogen target settings
  if (this->MocOrUicEnabled()) {
    // Init moc specific settings
    if (this->Moc.Enabled && !this->InitMoc()) {
      return false;
    }

    // Init uic specific settings
    if (this->Uic.Enabled && !this->InitUic()) {
      return false;
    }

    // Autogen target name
    this->AutogenTarget.Name =
      cmStrCat(this->GenTarget->GetName(), "_autogen");

    // Autogen target parallel processing
    {
      using ParallelType = decltype(this->AutogenTarget.Parallel);
      unsigned long propInt = 0;
      std::string const& prop =
        this->GenTarget->GetSafeProperty("AUTOGEN_PARALLEL");
      if (prop.empty() || (prop == "AUTO")) {
        // Autodetect number of CPUs
        this->AutogenTarget.Parallel = GetParallelCPUCount();
      } else if (cmStrToULong(prop, &propInt) && propInt > 0 &&
                 propInt <= std::numeric_limits<ParallelType>::max()) {
        this->AutogenTarget.Parallel = static_cast<ParallelType>(propInt);
      } else {
        // Warn the project author that AUTOGEN_PARALLEL is not valid.
        this->Makefile->IssueMessage(
          MessageType::AUTHOR_WARNING,
          cmStrCat("AUTOGEN_PARALLEL=\"", prop, "\" for target \"",
                   this->GenTarget->GetName(),
                   "\" is not valid. Using AUTOGEN_PARALLEL=1"));
        this->AutogenTarget.Parallel = 1;
      }
    }

#ifdef _WIN32
    {
      const auto& value =
        this->GenTarget->GetProperty("AUTOGEN_COMMAND_LINE_LENGTH_MAX");
      if (value.IsSet()) {
        using maxCommandLineLengthType =
          decltype(this->AutogenTarget.MaxCommandLineLength);
        unsigned long propInt = 0;
        if (cmStrToULong(value, &propInt) && propInt > 0 &&
            propInt <= std::numeric_limits<maxCommandLineLengthType>::max()) {
          this->AutogenTarget.MaxCommandLineLength =
            static_cast<maxCommandLineLengthType>(propInt);
        } else {
          // Warn the project author that AUTOGEN_PARALLEL is not valid.
          this->Makefile->IssueMessage(
            MessageType::AUTHOR_WARNING,
            cmStrCat("AUTOGEN_COMMAND_LINE_LENGTH_MAX=\"", *value,
                     "\" for target \"", this->GenTarget->GetName(),
                     "\" is not valid. Using no limit for "
                     "AUTOGEN_COMMAND_LINE_LENGTH_MAX"));
          this->AutogenTarget.MaxCommandLineLength =
            std::numeric_limits<maxCommandLineLengthType>::max();
        }
      } else {
        // Actually 32767 (see
        // https://devblogs.microsoft.com/oldnewthing/20031210-00/?p=41553) but
        // we allow for a small margin
        this->AutogenTarget.MaxCommandLineLength = 32000;
      }
    }
#endif

    // Autogen target info and settings files
    {
      // Info file
      this->AutogenTarget.InfoFile =
        cmStrCat(this->Dir.Info, "/AutogenInfo.json");

      // Used settings file
      this->ConfigFileNames(this->AutogenTarget.SettingsFile,
                            cmStrCat(this->Dir.Info, "/AutogenUsed"), ".txt");
      this->ConfigFileClean(this->AutogenTarget.SettingsFile);

      // Parse cache file
      this->ConfigFileNames(this->AutogenTarget.ParseCacheFile,
                            cmStrCat(this->Dir.Info, "/ParseCache"), ".txt");
      this->ConfigFileClean(this->AutogenTarget.ParseCacheFile);
    }

    // Autogen target: Compute user defined dependencies
    {
      this->AutogenTarget.DependOrigin =
        this->GenTarget->GetPropertyAsBool("AUTOGEN_ORIGIN_DEPENDS");

      std::string const& deps =
        this->GenTarget->GetSafeProperty("AUTOGEN_TARGET_DEPENDS");
      if (!deps.empty()) {
        for (auto const& depName : cmList{ deps }) {
          // Allow target and file dependencies
          auto* depTarget = this->Makefile->FindTargetToUse(depName);
          if (depTarget) {
            this->AutogenTarget.DependTargets.insert(depTarget);
          } else {
            this->AutogenTarget.DependFiles.insert(depName);
          }
        }
      }
    }

    if (this->Moc.Enabled) {
      // Path prefix
      if (this->GenTarget->GetProperty("AUTOMOC_PATH_PREFIX").IsOn()) {
        this->Moc.PathPrefix = true;
      }

      // CMAKE_AUTOMOC_RELAXED_MODE
      if (this->Makefile->IsOn("CMAKE_AUTOMOC_RELAXED_MODE")) {
        this->Moc.RelaxedMode = true;
        this->Makefile->IssueMessage(
          MessageType::AUTHOR_WARNING,
          cmStrCat("AUTOMOC: CMAKE_AUTOMOC_RELAXED_MODE is "
                   "deprecated an will be removed in the future.  Consider "
                   "disabling it and converting the target ",
                   this->GenTarget->GetName(), " to regular mode."));
      }

      // Options
      cmExpandList(this->GenTarget->GetSafeProperty("AUTOMOC_MOC_OPTIONS"),
                   this->Moc.Options);
      // Filters
      cmExpandList(this->GenTarget->GetSafeProperty("AUTOMOC_MACRO_NAMES"),
                   this->Moc.MacroNames);
      this->Moc.MacroNames.erase(cmRemoveDuplicates(this->Moc.MacroNames),
                                 this->Moc.MacroNames.end());
      {
        cmList const filterList = { this->GenTarget->GetSafeProperty(
          "AUTOMOC_DEPEND_FILTERS") };
        if ((filterList.size() % 2) != 0) {
          cmSystemTools::Error(
            cmStrCat("AutoMoc: AUTOMOC_DEPEND_FILTERS predefs size ",
                     filterList.size(), " is not a multiple of 2."));
          return false;
        }
        this->Moc.DependFilters.reserve(1 + (filterList.size() / 2));
        this->Moc.DependFilters.emplace_back(
          "Q_PLUGIN_METADATA",
          "[\n][ \t]*Q_PLUGIN_METADATA[ \t]*\\("
          "[^\\)]*FILE[ \t]*\"([^\"]+)\"");
        for (cmList::size_type ii = 0; ii != filterList.size(); ii += 2) {
          this->Moc.DependFilters.emplace_back(filterList[ii],
                                               filterList[ii + 1]);
        }
      }
    }
  }

  // Init rcc specific settings
  if (this->Rcc.Enabled && !this->InitRcc()) {
    return false;
  }

  // Add autogen include directory to the origin target INCLUDE_DIRECTORIES
  if (this->MocOrUicEnabled() || (this->Rcc.Enabled && this->MultiConfig)) {
    auto addBefore = false;
    auto const& value =
      this->GenTarget->GetProperty("AUTOGEN_USE_SYSTEM_INCLUDE");
    if (value.IsSet()) {
      if (value.IsOn()) {
        this->GenTarget->AddSystemIncludeDirectory(this->Dir.IncludeGenExp,
                                                   "CXX");
      } else {
        addBefore = true;
      }
    } else {
      switch (this->Makefile->GetPolicyStatus(cmPolicies::CMP0151)) {
        case cmPolicies::WARN:
        case cmPolicies::OLD:
          addBefore = true;
          break;
        case cmPolicies::REQUIRED_IF_USED:
        case cmPolicies::REQUIRED_ALWAYS:
        case cmPolicies::NEW:
          this->GenTarget->AddSystemIncludeDirectory(this->Dir.IncludeGenExp,
                                                     "CXX");
          break;
      }
    }
    this->GenTarget->AddIncludeDirectory(this->Dir.IncludeGenExp, addBefore);
  }

  // Scan files
  if (!this->InitScanFiles()) {
    return false;
  }

  // Create autogen target
  if (this->MocOrUicEnabled() && !this->InitAutogenTarget()) {
    return false;
  }

  // Create rcc targets
  if (this->Rcc.Enabled && !this->InitRccTargets()) {
    return false;
  }

  return true;
}